

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_3x3_pack16.h
# Opt level: O1

void ncnn::pooling3x3s2_max_pack16_avx512(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 (*pauVar1) [64];
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  undefined1 (*pauVar14) [64];
  undefined1 (*pauVar15) [64];
  undefined1 (*pauVar16) [64];
  undefined1 (*pauVar17) [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  
  iVar2 = bottom_blob->c;
  if (0 < (long)iVar2) {
    uVar3 = top_blob->w;
    iVar4 = top_blob->h;
    lVar12 = (long)(int)((bottom_blob->w - uVar3) * 0x20);
    lVar11 = 0;
    do {
      if (0 < iVar4) {
        pauVar16 = (undefined1 (*) [64])
                   (bottom_blob->cstep * lVar11 * bottom_blob->elemsize + (long)bottom_blob->data);
        lVar13 = (long)bottom_blob->w * bottom_blob->elemsize;
        pauVar15 = (undefined1 (*) [64])(*pauVar16 + lVar13 * 2);
        pauVar14 = (undefined1 (*) [64])(*pauVar16 + lVar13);
        pauVar17 = (undefined1 (*) [64])
                   (top_blob->cstep * lVar11 * top_blob->elemsize + (long)top_blob->data);
        iVar8 = 0;
        do {
          if ((int)uVar3 < 4) {
            uVar6 = 0;
          }
          else {
            iVar5 = 3;
            do {
              auVar18 = vmaxps_avx512f(*pauVar16,pauVar16[1]);
              auVar18 = vmaxps_avx512f(auVar18,pauVar16[2]);
              auVar18 = vmaxps_avx512f(auVar18,*pauVar14);
              auVar19 = vmaxps_avx512f(auVar18,pauVar14[1]);
              auVar18 = pauVar16[4];
              auVar20 = vmaxps_avx512f(pauVar14[2],*pauVar15);
              auVar24 = pauVar14[4];
              auVar21 = vmaxps_avx512f(auVar20,pauVar15[1]);
              auVar20 = pauVar15[2];
              auVar21 = vmaxps_avx512f(auVar21,auVar20);
              auVar21 = vmaxps_avx512f(auVar19,auVar21);
              auVar22 = vmaxps_avx512f(auVar18,pauVar16[3]);
              auVar19 = pauVar15[4];
              auVar22 = vmaxps_avx512f(auVar22,pauVar16[2]);
              auVar22 = vmaxps_avx512f(auVar22,pauVar14[3]);
              auVar23 = vmaxps_avx512f(pauVar14[2],pauVar15[3]);
              *pauVar17 = auVar21;
              auVar21 = vmaxps_avx512f(auVar24,auVar19);
              auVar20 = vmaxps_avx512f(auVar21,auVar20);
              auVar20 = vmaxps_avx512f(auVar20,auVar23);
              auVar22 = vmaxps_avx512f(auVar22,auVar20);
              auVar20 = pauVar16[6];
              auVar21 = pauVar14[6];
              auVar23 = vmaxps_avx512f(auVar20,pauVar16[5]);
              auVar18 = vmaxps_avx512f(auVar23,auVar18);
              auVar23 = vmaxps_avx512f(auVar18,pauVar14[5]);
              auVar24 = vmaxps_avx512f(auVar24,pauVar15[5]);
              auVar18 = pauVar15[6];
              pauVar17[1] = auVar22;
              auVar22 = vmaxps_avx512f(auVar21,auVar18);
              auVar19 = vmaxps_avx512f(auVar22,auVar19);
              auVar24 = vmaxps_avx512f(auVar19,auVar24);
              auVar19 = vmaxps_avx512f(pauVar16[7],pauVar16[8]);
              auVar24 = vmaxps_avx512f(auVar23,auVar24);
              auVar20 = vmaxps_avx512f(auVar19,auVar20);
              auVar20 = vmaxps_avx512f(auVar20,pauVar14[7]);
              auVar20 = vmaxps_avx512f(auVar20,pauVar14[8]);
              auVar19 = vmaxps_avx512f(auVar21,pauVar15[7]);
              pauVar14 = pauVar14 + 8;
              auVar20 = vmaxps_avx512f(auVar20,pauVar15[8]);
              pauVar15 = pauVar15 + 8;
              pauVar16 = pauVar16 + 8;
              pauVar17[2] = auVar24;
              auVar18 = vmaxps_avx512f(auVar18,auVar19);
              auVar18 = vmaxps_avx512f(auVar20,auVar18);
              pauVar17[3] = auVar18;
              pauVar17 = pauVar17 + 4;
              iVar5 = iVar5 + 4;
              uVar6 = uVar3 & 0xfffffffc;
            } while (iVar5 < (int)uVar3);
          }
          uVar9 = uVar6 | 1;
          while ((int)uVar9 < (int)uVar3) {
            pauVar1 = pauVar14 + 2;
            auVar18 = pauVar15[2];
            auVar24 = vmaxps_avx512f(*pauVar16,pauVar16[1]);
            auVar24 = vmaxps_avx512f(auVar24,pauVar16[2]);
            auVar24 = vmaxps_avx512f(auVar24,*pauVar14);
            auVar24 = vmaxps_avx512f(auVar24,pauVar14[1]);
            auVar20 = vmaxps_avx512f(*pauVar1,*pauVar15);
            auVar20 = vmaxps_avx512f(auVar20,pauVar15[1]);
            auVar20 = vmaxps_avx512f(auVar20,auVar18);
            auVar19 = vmaxps_avx512f(pauVar16[3],pauVar16[4]);
            auVar19 = vmaxps_avx512f(auVar19,pauVar16[2]);
            auVar19 = vmaxps_avx512f(auVar19,pauVar14[3]);
            auVar19 = vmaxps_avx512f(auVar19,pauVar14[4]);
            auVar24 = vmaxps_avx512f(auVar24,auVar20);
            pauVar14 = pauVar14 + 4;
            auVar20 = vmaxps_avx512f(*pauVar1,pauVar15[3]);
            auVar19 = vmaxps_avx512f(auVar19,pauVar15[4]);
            pauVar15 = pauVar15 + 4;
            pauVar16 = pauVar16 + 4;
            *pauVar17 = auVar24;
            auVar18 = vmaxps_avx512f(auVar18,auVar20);
            auVar18 = vmaxps_avx512f(auVar19,auVar18);
            pauVar17[1] = auVar18;
            pauVar17 = pauVar17 + 2;
            uVar9 = uVar6 + 3;
            uVar6 = uVar6 + 2;
          }
          iVar5 = uVar3 - uVar6;
          if (iVar5 != 0 && (int)uVar6 <= (int)uVar3) {
            lVar7 = 0;
            lVar13 = 0;
            do {
              lVar10 = lVar13;
              auVar18 = vmaxps_avx512f(*(undefined1 (*) [64])(*pauVar16 + lVar10 * 2),
                                       *(undefined1 (*) [64])(pauVar16[1] + lVar10 * 2));
              auVar18 = vmaxps_avx512f(auVar18,*(undefined1 (*) [64])(pauVar16[2] + lVar10 * 2));
              auVar18 = vmaxps_avx512f(auVar18,*(undefined1 (*) [64])(*pauVar14 + lVar10 * 2));
              auVar18 = vmaxps_avx512f(auVar18,*(undefined1 (*) [64])(pauVar14[1] + lVar10 * 2));
              auVar24 = vmaxps_avx512f(*(undefined1 (*) [64])(pauVar14[2] + lVar10 * 2),
                                       *(undefined1 (*) [64])(*pauVar15 + lVar10 * 2));
              auVar24 = vmaxps_avx512f(auVar24,*(undefined1 (*) [64])(pauVar15[1] + lVar10 * 2));
              auVar24 = vmaxps_avx512f(auVar24,*(undefined1 (*) [64])(pauVar15[2] + lVar10 * 2));
              auVar18 = vmaxps_avx512f(auVar18,auVar24);
              *(undefined1 (*) [64])((long)*pauVar17 + lVar10) = auVar18;
              lVar7 = lVar7 + -0x80;
              iVar5 = iVar5 + -1;
              lVar13 = lVar10 + 0x40;
            } while (iVar5 != 0);
            pauVar17 = (undefined1 (*) [64])(pauVar17[1] + lVar10);
            pauVar16 = (undefined1 (*) [64])((long)pauVar16 - lVar7);
            pauVar14 = (undefined1 (*) [64])((long)pauVar14 - lVar7);
            pauVar15 = (undefined1 (*) [64])((long)pauVar15 - lVar7);
          }
          pauVar16 = (undefined1 (*) [64])(*pauVar16 + lVar12 * 4);
          pauVar14 = (undefined1 (*) [64])(*pauVar14 + lVar12 * 4);
          pauVar15 = (undefined1 (*) [64])(*pauVar15 + lVar12 * 4);
          iVar8 = iVar8 + 1;
        } while (iVar8 != iVar4);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != iVar2);
  }
  return;
}

Assistant:

static void pooling3x3s2_max_pack16_avx512(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int tailstep = (w - 2 * outw + w) * 16;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < inch; q++)
    {
        const Mat img0 = bottom_blob.channel(q);
        float* outptr = top_blob.channel(q);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);
        for (int i = 0; i < outh; i++)
        {
            int j = 0;
            for (; j + 3 < outw; j += 4)
            {
                __m512 _r00 = _mm512_loadu_ps(r0);
                __m512 _r01 = _mm512_loadu_ps(r0 + 16);
                __m512 _r02 = _mm512_loadu_ps(r0 + 32);
                __m512 _r10 = _mm512_loadu_ps(r1);
                __m512 _r11 = _mm512_loadu_ps(r1 + 16);
                __m512 _r12 = _mm512_loadu_ps(r1 + 32);
                __m512 _r20 = _mm512_loadu_ps(r2);
                __m512 _r21 = _mm512_loadu_ps(r2 + 16);
                __m512 _r22 = _mm512_loadu_ps(r2 + 32);

                __m512 _max00 = _mm512_max_ps(_r00, _r01);
                _max00 = _mm512_max_ps(_max00, _r02);
                _max00 = _mm512_max_ps(_max00, _r10);
                _max00 = _mm512_max_ps(_max00, _r11);
                __m512 _max01 = _mm512_max_ps(_r12, _r20);
                _max01 = _mm512_max_ps(_max01, _r21);
                _max01 = _mm512_max_ps(_max01, _r22);

                __m512 _r03 = _mm512_loadu_ps(r0 + 48);
                __m512 _r04 = _mm512_loadu_ps(r0 + 64);
                __m512 _r13 = _mm512_loadu_ps(r1 + 48);
                __m512 _r14 = _mm512_loadu_ps(r1 + 64);
                __m512 _r23 = _mm512_loadu_ps(r2 + 48);
                __m512 _r24 = _mm512_loadu_ps(r2 + 64);

                _mm512_storeu_ps(outptr, _mm512_max_ps(_max00, _max01));

                __m512 _max10 = _mm512_max_ps(_r03, _r04);
                _max10 = _mm512_max_ps(_max10, _r02);
                _max10 = _mm512_max_ps(_max10, _r13);
                _max10 = _mm512_max_ps(_max10, _r14);
                __m512 _max11 = _mm512_max_ps(_r12, _r23);
                _max10 = _mm512_max_ps(_max10, _r24);
                _max10 = _mm512_max_ps(_max10, _r22);

                __m512 _r05 = _mm512_loadu_ps(r0 + 80);
                __m512 _r06 = _mm512_loadu_ps(r0 + 96);
                __m512 _r15 = _mm512_loadu_ps(r1 + 80);
                __m512 _r16 = _mm512_loadu_ps(r1 + 96);
                __m512 _r25 = _mm512_loadu_ps(r2 + 80);
                __m512 _r26 = _mm512_loadu_ps(r2 + 96);

                _mm512_storeu_ps(outptr + 16, _mm512_max_ps(_max10, _max11));

                __m512 _max20 = _mm512_max_ps(_r05, _r06);
                _max20 = _mm512_max_ps(_max20, _r04);
                _max20 = _mm512_max_ps(_max20, _r15);
                _max20 = _mm512_max_ps(_max20, _r16);
                __m512 _max21 = _mm512_max_ps(_r14, _r25);
                _max20 = _mm512_max_ps(_max20, _r26);
                _max20 = _mm512_max_ps(_max20, _r24);

                __m512 _r07 = _mm512_loadu_ps(r0 + 112);
                __m512 _r08 = _mm512_loadu_ps(r0 + 128);
                __m512 _r17 = _mm512_loadu_ps(r1 + 112);
                __m512 _r18 = _mm512_loadu_ps(r1 + 128);
                __m512 _r27 = _mm512_loadu_ps(r2 + 112);
                __m512 _r28 = _mm512_loadu_ps(r2 + 128);

                _mm512_storeu_ps(outptr + 32, _mm512_max_ps(_max20, _max21));

                __m512 _max30 = _mm512_max_ps(_r07, _r08);
                _max30 = _mm512_max_ps(_max30, _r06);
                _max30 = _mm512_max_ps(_max30, _r17);
                _max30 = _mm512_max_ps(_max30, _r18);
                __m512 _max31 = _mm512_max_ps(_r16, _r27);
                _max30 = _mm512_max_ps(_max30, _r28);
                _max30 = _mm512_max_ps(_max30, _r26);

                _mm512_storeu_ps(outptr + 48, _mm512_max_ps(_max30, _max31));

                r0 += 128;
                r1 += 128;
                r2 += 128;
                outptr += 64;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m512 _r00 = _mm512_loadu_ps(r0);
                __m512 _r01 = _mm512_loadu_ps(r0 + 16);
                __m512 _r02 = _mm512_loadu_ps(r0 + 32);
                __m512 _r10 = _mm512_loadu_ps(r1);
                __m512 _r11 = _mm512_loadu_ps(r1 + 16);
                __m512 _r12 = _mm512_loadu_ps(r1 + 32);
                __m512 _r20 = _mm512_loadu_ps(r2);
                __m512 _r21 = _mm512_loadu_ps(r2 + 16);
                __m512 _r22 = _mm512_loadu_ps(r2 + 32);

                __m512 _max00 = _mm512_max_ps(_r00, _r01);
                _max00 = _mm512_max_ps(_max00, _r02);
                _max00 = _mm512_max_ps(_max00, _r10);
                _max00 = _mm512_max_ps(_max00, _r11);
                __m512 _max01 = _mm512_max_ps(_r12, _r20);
                _max01 = _mm512_max_ps(_max01, _r21);
                _max01 = _mm512_max_ps(_max01, _r22);

                __m512 _r03 = _mm512_loadu_ps(r0 + 48);
                __m512 _r04 = _mm512_loadu_ps(r0 + 64);
                __m512 _r13 = _mm512_loadu_ps(r1 + 48);
                __m512 _r14 = _mm512_loadu_ps(r1 + 64);
                __m512 _r23 = _mm512_loadu_ps(r2 + 48);
                __m512 _r24 = _mm512_loadu_ps(r2 + 64);

                _mm512_storeu_ps(outptr, _mm512_max_ps(_max00, _max01));

                __m512 _max10 = _mm512_max_ps(_r03, _r04);
                _max10 = _mm512_max_ps(_max10, _r02);
                _max10 = _mm512_max_ps(_max10, _r13);
                _max10 = _mm512_max_ps(_max10, _r14);
                __m512 _max11 = _mm512_max_ps(_r12, _r23);
                _max10 = _mm512_max_ps(_max10, _r24);
                _max10 = _mm512_max_ps(_max10, _r22);

                _mm512_storeu_ps(outptr + 16, _mm512_max_ps(_max10, _max11));

                r0 += 64;
                r1 += 64;
                r2 += 64;
                outptr += 32;
            }

            for (; j < outw; j++)
            {
                __m512 _r00 = _mm512_loadu_ps(r0);
                __m512 _r01 = _mm512_loadu_ps(r0 + 16);
                __m512 _r02 = _mm512_loadu_ps(r0 + 32);
                __m512 _r10 = _mm512_loadu_ps(r1);
                __m512 _r11 = _mm512_loadu_ps(r1 + 16);
                __m512 _r12 = _mm512_loadu_ps(r1 + 32);
                __m512 _r20 = _mm512_loadu_ps(r2);
                __m512 _r21 = _mm512_loadu_ps(r2 + 16);
                __m512 _r22 = _mm512_loadu_ps(r2 + 32);

                __m512 _max0 = _mm512_max_ps(_r00, _r01);
                _max0 = _mm512_max_ps(_max0, _r02);
                _max0 = _mm512_max_ps(_max0, _r10);
                _max0 = _mm512_max_ps(_max0, _r11);
                __m512 _max1 = _mm512_max_ps(_r12, _r20);
                _max1 = _mm512_max_ps(_max1, _r21);
                _max1 = _mm512_max_ps(_max1, _r22);

                _mm512_storeu_ps(outptr, _mm512_max_ps(_max0, _max1));

                r0 += 32;
                r1 += 32;
                r2 += 32;
                outptr += 16;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}